

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

int __thiscall
QMetaEnumBuilderPrivate::addKey(QMetaEnumBuilderPrivate *this,QByteArray *name,quint64 value)

{
  qsizetype qVar1;
  
  qVar1 = (this->keys).d.size;
  QList<QByteArray>::emplaceBack<QByteArray_const&>(&this->keys,name);
  QList<unsigned_long_long>::append(&this->values,value);
  return (int)qVar1;
}

Assistant:

int addKey(const QByteArray &name, quint64 value)
    {
        int index = keys.size();
        keys += name;
        values += value;
        return index;
    }